

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ScriptWitness * __thiscall
cfd::core::ConfidentialTransaction::SetPeginWitnessStack
          (ScriptWitness *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t tx_in_index,
          uint32_t witness_index,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  undefined8 stack;
  uint32_t index;
  bool bVar1;
  ulong index_00;
  uchar *witness_00;
  size_type witness_len;
  CfdException *this_00;
  reference this_01;
  ByteData local_f8;
  ScriptWitness local_e0;
  ScriptWitness *local_c0;
  ScriptWitness *witness;
  string local_b0;
  CfdSourceLocation local_90;
  allocator local_61;
  undefined1 local_60 [8];
  string function_name;
  wally_tx_witness_stack *stack_pointer;
  void *pvStack_30;
  int ret;
  wally_tx *tx_pointer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  uint32_t witness_index_local;
  uint32_t tx_in_index_local;
  ConfidentialTransaction *this_local;
  
  tx_pointer = (wally_tx *)data;
  data_local._0_4_ = witness_index;
  data_local._4_4_ = tx_in_index;
  _witness_index_local = this;
  this_local = (ConfidentialTransaction *)__return_storage_ptr__;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x6f2,"SetPeginWitnessStack");
  pvStack_30 = (this->super_AbstractTransaction).wally_tx_pointer_;
  if ((ulong)data_local._4_4_ < *(ulong *)((long)pvStack_30 + 0x10)) {
    stack_pointer._4_4_ = -2;
    function_name.field_2._8_8_ = 0;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_60,"wally witness is NULL.",&local_61);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
    if (*(long *)(*(long *)((long)pvStack_30 + 8) + (ulong)data_local._4_4_ * 0xd0 + 200) != 0) {
      function_name.field_2._8_8_ =
           *(undefined8 *)(*(long *)((long)pvStack_30 + 8) + 200 + (ulong)data_local._4_4_ * 0xd0);
      ::std::__cxx11::string::operator=((string *)local_60,"wally_tx_witness_stack_set");
      bVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)tx_pointer);
      stack = function_name.field_2._8_8_;
      if (bVar1) {
        stack_pointer._4_4_ =
             wally_tx_witness_stack_set
                       ((wally_tx_witness_stack *)function_name.field_2._8_8_,
                        (ulong)(uint32_t)data_local,(uchar *)0x0,0);
      }
      else {
        index_00 = (ulong)(uint32_t)data_local;
        witness_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)tx_pointer)
        ;
        witness_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)tx_pointer
                                );
        stack_pointer._4_4_ =
             wally_tx_witness_stack_set
                       ((wally_tx_witness_stack *)stack,index_00,witness_00,witness_len);
      }
    }
    if (stack_pointer._4_4_ != 0) {
      local_90.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_90.filename = local_90.filename + 1;
      local_90.line = 0x70a;
      local_90.funcname = "SetPeginWitnessStack";
      logger::warn<std::__cxx11::string&,int&>
                (&local_90,"{} NG[{}].",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 (int *)((long)&stack_pointer + 4));
      witness._6_1_ = 1;
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_b0,"witness stack set error.",(allocator *)((long)&witness + 7));
      CfdException::CfdException(this_00,kCfdIllegalStateError,&local_b0);
      witness._6_1_ = 0;
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::__cxx11::string::~string((string *)local_60);
  }
  SetElementsTxState(this);
  this_01 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ::operator[](&this->vin_,(ulong)data_local._4_4_);
  index = (uint32_t)data_local;
  ByteData::ByteData(&local_f8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)tx_pointer);
  ConfidentialTxIn::SetPeginWitnessStack(&local_e0,this_01,index,&local_f8);
  ByteData::~ByteData(&local_f8);
  local_c0 = &local_e0;
  ScriptWitness::ScriptWitness(__return_storage_ptr__,local_c0);
  ScriptWitness::~ScriptWitness(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness ConfidentialTransaction::SetPeginWitnessStack(
    uint32_t tx_in_index, uint32_t witness_index,
    const std::vector<uint8_t> &data) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    int ret = WALLY_EINVAL;
    struct wally_tx_witness_stack *stack_pointer = NULL;

    std::string function_name = "wally witness is NULL.";
    if (tx_pointer->inputs[tx_in_index].pegin_witness != NULL) {
      stack_pointer = tx_pointer->inputs[tx_in_index].pegin_witness;

      // append witness stack
      function_name = "wally_tx_witness_stack_set";
      if (data.empty()) {
        ret =
            wally_tx_witness_stack_set(stack_pointer, witness_index, NULL, 0);
      } else {
        ret = wally_tx_witness_stack_set(
            stack_pointer, witness_index, data.data(), data.size());
      }
    }

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "{} NG[{}].", function_name, ret);
      throw CfdException(kCfdIllegalStateError, "witness stack set error.");
    }
  }
  SetElementsTxState();

  const ScriptWitness &witness =
      vin_[tx_in_index].SetPeginWitnessStack(witness_index, ByteData(data));
  return witness;
}